

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_audio_buffer_ref_read_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,void *pFramesOut,ma_uint64 frameCount,
                    ma_bool32 loop)

{
  ulong uVar1;
  void *__src;
  void *__dest;
  ulong uVar2;
  ulong uVar3;
  ma_uint64 mVar4;
  
  if (frameCount == 0 || pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
      uVar3 = frameCount - uVar2;
      if (uVar1 <= frameCount - uVar2) {
        uVar3 = uVar1;
      }
      if (pFramesOut != (void *)0x0) {
        uVar1 = (ulong)((&DAT_0019eb10)[pAudioBufferRef->format] * pAudioBufferRef->channels);
        __dest = (void *)(uVar2 * uVar1 + (long)pFramesOut);
        __src = (void *)(pAudioBufferRef->cursor * uVar1 + (long)pAudioBufferRef->pData);
        if (__dest != __src) {
          memcpy(__dest,__src,uVar1 * uVar3);
        }
      }
      uVar2 = uVar2 + uVar3;
      mVar4 = uVar3 + pAudioBufferRef->cursor;
      pAudioBufferRef->cursor = mVar4;
      if (mVar4 == pAudioBufferRef->sizeInFrames) {
        if (loop == 0) {
          return uVar2;
        }
        pAudioBufferRef->cursor = 0;
      }
    } while (uVar2 < frameCount);
  }
  return uVar2;
}

Assistant:

MA_API ma_uint64 ma_audio_buffer_ref_read_pcm_frames(ma_audio_buffer_ref* pAudioBufferRef, void* pFramesOut, ma_uint64 frameCount, ma_bool32 loop)
{
    ma_uint64 totalFramesRead = 0;

    if (pAudioBufferRef == NULL) {
        return 0;
    }

    if (frameCount == 0) {
        return 0;
    }

    while (totalFramesRead < frameCount) {
        ma_uint64 framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
        ma_uint64 framesRemaining = frameCount - totalFramesRead;
        ma_uint64 framesToRead;

        framesToRead = framesRemaining;
        if (framesToRead > framesAvailable) {
            framesToRead = framesAvailable;
        }

        if (pFramesOut != NULL) {
            ma_copy_pcm_frames(ma_offset_ptr(pFramesOut, totalFramesRead * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), framesToRead, pAudioBufferRef->format, pAudioBufferRef->channels);
        }

        totalFramesRead += framesToRead;

        pAudioBufferRef->cursor += framesToRead;
        if (pAudioBufferRef->cursor == pAudioBufferRef->sizeInFrames) {
            if (loop) {
                pAudioBufferRef->cursor = 0;
            } else {
                break;  /* We've reached the end and we're not looping. Done. */
            }
        }

        MA_ASSERT(pAudioBufferRef->cursor < pAudioBufferRef->sizeInFrames);
    }

    return totalFramesRead;
}